

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O0

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::_internal_mutable_options(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  long in_RDI;
  FileOptions *p;
  FileDescriptorProto *in_stack_ffffffffffffffe0;
  
  *(uint *)(in_RDI + 0x10) = *(uint *)(in_RDI + 0x10) | 8;
  if (*(long *)(in_RDI + 200) == 0) {
    GetArenaNoVirtual(in_stack_ffffffffffffffe0);
    pFVar1 = MessageLite::CreateMaybeMessage<google::protobuf::FileOptions>((Arena *)0x4e5434);
    *(FileOptions **)(in_RDI + 200) = pFVar1;
  }
  return *(FileOptions **)(in_RDI + 200);
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::FileOptions* FileDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000008u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::FileOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}